

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::raw_log(Verbosity verbosity,char *file,uint line,char *format,...)

{
  undefined1 local_88 [8];
  Message message;
  Text buff;
  va_list vlist;
  char *format_local;
  uint line_local;
  char *file_local;
  Verbosity verbosity_local;
  
  buff._str._4_4_ = 0x30;
  buff._str._0_4_ = 0x20;
  vtextprintf((loguru *)&message.message,format,(__va_list_tag *)&buff);
  message._16_8_ = (long)"PK\x01\x02" + 4;
  message.preamble = "";
  message.indentation = "";
  local_88._0_4_ = verbosity;
  message._0_8_ = file;
  message.filename._0_4_ = line;
  message.prefix = Text::c_str((Text *)&message.message);
  log_message(1,(Message *)local_88,false,true);
  Text::~Text((Text *)&message.message);
  return;
}

Assistant:

void raw_log(Verbosity verbosity, const char* file, unsigned line, const char* format, ...)
	{
		va_list vlist;
		va_start(vlist, format);
		auto buff = vtextprintf(format, vlist);
		auto message = Message{verbosity, file, line, "", "", "", buff.c_str()};
		log_message(1, message, false, true);
		va_end(vlist);
	}